

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::
consume_comment_start
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  parser<pstore::exchange::import_ns::callbacks> *parser_00;
  bool bVar1;
  bool local_41;
  void *local_40;
  error_code local_38;
  char local_21;
  parser<pstore::exchange::import_ns::callbacks> *ppStack_20;
  char c_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  whitespace_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_21 = c;
  ppStack_20 = parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  this_local = (whitespace_matcher<pstore::exchange::import_ns::callbacks> *)__return_storage_ptr__;
  if ((c == '/') &&
     (bVar1 = parser<pstore::exchange::import_ns::callbacks>::extension_enabled
                        (parser,single_line_comments), bVar1)) {
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,4);
  }
  else if ((local_21 == '*') &&
          (bVar1 = parser<pstore::exchange::import_ns::callbacks>::extension_enabled
                             (ppStack_20,multi_line_comments), bVar1)) {
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,6);
  }
  else {
    parser_00 = ppStack_20;
    std::error_code::error_code<pstore::json::error_code,void>(&local_38,expected_token);
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser_00,&local_38);
  }
  local_40 = (void *)0x0;
  local_41 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_40,&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume_comment_start (parser<Callbacks> & parser,
                                                                  char c) {
                using details::char_set;
                if (c == char_set::slash &&
                    parser.extension_enabled (extensions::single_line_comments)) {
                    this->set_state (single_line_comment_state);
                } else if (c == char_set::star &&
                           parser.extension_enabled (extensions::multi_line_comments)) {
                    this->set_state (multi_line_comment_body_state);
                } else {
                    this->set_error (parser, error_code::expected_token);
                }
                return {nullptr, true}; // Consume this character.
            }